

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BuilderTest_build_gauge_Test::TestBody
          (BuilderTest_build_gauge_Test *this)

{
  Builder<prometheus::Gauge> *pBVar1;
  Family<prometheus::Gauge> *this_00;
  Builder<prometheus::Gauge> local_88;
  Family<prometheus::Gauge> *local_18;
  Family<prometheus::Gauge> *family;
  BuilderTest_build_gauge_Test *this_local;
  
  family = (Family<prometheus::Gauge> *)this;
  BuildGauge();
  pBVar1 = detail::Builder<prometheus::Gauge>::Name(&local_88,&(this->super_BuilderTest).name);
  pBVar1 = detail::Builder<prometheus::Gauge>::Help(pBVar1,&(this->super_BuilderTest).help);
  pBVar1 = detail::Builder<prometheus::Gauge>::Labels
                     (pBVar1,&(this->super_BuilderTest).const_labels);
  this_00 = detail::Builder<prometheus::Gauge>::Register(pBVar1,&(this->super_BuilderTest).registry)
  ;
  detail::Builder<prometheus::Gauge>::~Builder(&local_88);
  local_18 = this_00;
  Family<prometheus::Gauge>::Add<>(this_00,&(this->super_BuilderTest).more_labels);
  BuilderTest::verifyCollectedLabels(&this->super_BuilderTest);
  return;
}

Assistant:

TEST_F(BuilderTest, build_gauge) {
  auto& family = BuildGauge()
                     .Name(name)
                     .Help(help)
                     .Labels(const_labels)
                     .Register(registry);
  family.Add(more_labels);

  verifyCollectedLabels();
}